

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix __thiscall Matrix::operator/(Matrix *this,FLOAT *s)

{
  int iVar1;
  uint uVar2;
  FLOAT **ppFVar3;
  long lVar4;
  FLOAT *pFVar5;
  ostream *poVar6;
  double *in_RDX;
  FLOAT extraout_RDX;
  FLOAT FVar7;
  long lVar8;
  ulong uVar9;
  Matrix MVar10;
  
  if (1e-20 <= ABS(*in_RDX)) {
    Matrix(this,*(int32_t *)(s + 1),*(int32_t *)((long)s + 0xc));
    iVar1 = *(int *)(s + 1);
    FVar7 = extraout_RDX;
    if (0 < (long)iVar1) {
      uVar2 = *(uint *)((long)s + 0xc);
      FVar7 = *s;
      ppFVar3 = this->val;
      lVar8 = 0;
      do {
        if (0 < (int)uVar2) {
          lVar4 = *(long *)((long)FVar7 + lVar8 * 8);
          pFVar5 = ppFVar3[lVar8];
          uVar9 = 0;
          do {
            pFVar5[uVar9] = *(double *)(lVar4 + uVar9 * 8) / *in_RDX;
            uVar9 = uVar9 + 1;
          } while (uVar2 != uVar9);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar1);
    }
    MVar10._8_8_ = FVar7;
    MVar10.val = (FLOAT **)this;
    return MVar10;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"ERROR: Trying to divide by zero!");
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(0);
}

Assistant:

Matrix Matrix::operator/ (const FLOAT &s) {
  if (fabs(s)<1e-20) {
    cerr << "ERROR: Trying to divide by zero!" << endl;
    exit(0);
  }
  Matrix C(m,n);
  for (int32_t i=0; i<m; i++)
    for (int32_t j=0; j<n; j++)
      C.val[i][j] = val[i][j]/s;
  return C;
}